

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O2

void re2c::prtCh(ostream *o,uint32_t c)

{
  opt_t *poVar1;
  char *pcVar2;
  char *pcVar3;
  
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  switch(c) {
  case 7:
    pcVar2 = "\\\\a";
    pcVar3 = "\\a";
    break;
  case 8:
    pcVar2 = "\\\\b";
    pcVar3 = "\\b";
    break;
  case 9:
    pcVar2 = "\\\\t";
    pcVar3 = "\\t";
    break;
  case 10:
    pcVar2 = "\\\\n";
    pcVar3 = "\\n";
    break;
  case 0xb:
    pcVar2 = "\\\\v";
    pcVar3 = "\\v";
    break;
  case 0xc:
    pcVar2 = "\\\\f";
    pcVar3 = "\\f";
    break;
  case 0xd:
    pcVar2 = "\\\\r";
    pcVar3 = "\\r";
    break;
  default:
    if (c == 0x22) {
      pcVar2 = "\\\"";
      pcVar3 = "\"";
    }
    else {
      if (c == 0x5c) {
        pcVar3 = "\\\\";
        goto LAB_0012f213;
      }
      if (c != 0x27) {
        std::operator<<(o,(char)c);
        return;
      }
      pcVar2 = "\'";
      pcVar3 = "\\\'";
    }
  }
  if (poVar1->target == DOT) {
    pcVar3 = pcVar2;
  }
LAB_0012f213:
  std::operator<<(o,pcVar3);
  return;
}

Assistant:

void prtCh(std::ostream& o, uint32_t c)
{
	const bool dot = opts->target == opt_t::DOT;

	switch (c)
	{
		case '\'':
		o << (dot ? "'" : "\\'");
		break;

		case '"':
		o << (dot ? "\\\"" : "\"");
		break;

		case '\n':
		o << (dot ? "\\\\n" : "\\n");
		break;

		case '\t':
		o << (dot ? "\\\\t" : "\\t");
		break;

		case '\v':
		o << (dot ? "\\\\v" : "\\v");
		break;

		case '\b':
		o << (dot ? "\\\\b" : "\\b");
		break;

		case '\r':
		o << (dot ? "\\\\r" : "\\r");
		break;

		case '\f':
		o << (dot ? "\\\\f" : "\\f");
		break;

		case '\a':
		o << (dot ? "\\\\a" :"\\a");
		break;

		case '\\':
		o << "\\\\"; // both .dot and C/C++ code expect "\\"
		break;

		default:
		o << static_cast<char> (c);
		break;
	}
}